

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O3

type dlib::assign_pixel_helpers::assign<dlib::rgb_pixel,dlib::rgb_alpha_pixel>
               (rgb_pixel *dest,rgb_alpha_pixel *src)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = src->alpha;
  if (bVar1 != 0xff) {
    bVar2 = src->green;
    bVar3 = src->blue;
    dest->red = (char)(((uint)src->red - (uint)dest->red) * (uint)bVar1 >> 8) + dest->red;
    dest->green = (char)(((uint)bVar2 - (uint)dest->green) * (uint)bVar1 >> 8) + dest->green;
    dest->blue = (char)(((uint)bVar3 - (uint)dest->blue) * (uint)bVar1 >> 8) + dest->blue;
    return;
  }
  dest->red = src->red;
  dest->green = src->green;
  dest->blue = src->blue;
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::rgb && pixel_traits<P2>::rgb_alpha>::type
        assign(P1& dest, const P2& src) 
        { 
            if (src.alpha == 255)
            {
                dest.red = src.red;
                dest.green = src.green;
                dest.blue = src.blue;
            }
            else
            {
                // perform this assignment using fixed point arithmetic: 
                // dest = src*(alpha/255) + dest*(1 - alpha/255);
                // dest = src*(alpha/255) + dest*1 - dest*(alpha/255);
                // dest = dest*1 + src*(alpha/255) - dest*(alpha/255);
                // dest = dest*1 + (src - dest)*(alpha/255);
                // dest += (src - dest)*(alpha/255);

                unsigned int temp_r = src.red;
                unsigned int temp_g = src.green;
                unsigned int temp_b = src.blue;

                temp_r -= dest.red;
                temp_g -= dest.green;
                temp_b -= dest.blue;

                temp_r *= src.alpha;
                temp_g *= src.alpha;
                temp_b *= src.alpha;

                temp_r >>= 8;
                temp_g >>= 8;
                temp_b >>= 8;

                dest.red += static_cast<unsigned char>(temp_r&0xFF);
                dest.green += static_cast<unsigned char>(temp_g&0xFF);
                dest.blue += static_cast<unsigned char>(temp_b&0xFF);
            }
        }